

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core_read.cpp
# Opt level: O2

CScript * ParseScript(CScript *__return_storage_ptr__,string *s)

{
  uint uVar1;
  long lVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  char *pcVar3;
  pointer pcVar4;
  ulong uVar5;
  uint uVar6;
  bool bVar7;
  int iVar8;
  const_iterator cVar9;
  mapped_type *pmVar10;
  runtime_error *prVar11;
  CScript *pCVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  char *in_R9;
  opcodetype opcode;
  pointer this_00;
  long in_FS_OFFSET;
  string_view str;
  string_view separators;
  string_view str_00;
  string_view str_01;
  optional<long> oVar13;
  string_view hex_str;
  span<const_std::byte,_18446744073709551615UL> b;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  vector<unsigned_char,_std::allocator<unsigned_char>_> raw;
  vector<unsigned_char,_std::allocator<unsigned_char>_> value;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)((long)&(__return_storage_ptr__->super_CScriptBase)._union + 0x10) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super_CScriptBase)._union + 0x18) = 0;
  (__return_storage_ptr__->super_CScriptBase)._union.indirect_contents.indirect = (char *)0x0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super_CScriptBase)._union + 8) = 0;
  str._M_str = (char *)0x3;
  str._M_len = (size_t)(s->_M_dataplus)._M_p;
  separators._M_str = in_R9;
  separators._M_len = (size_t)" \t\n";
  util::SplitString_abi_cxx11_(&words,(util *)s->_M_string_length,str,separators);
  this_00 = words.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (this_00 ==
        words.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&words);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        return __return_storage_ptr__;
      }
LAB_00139243:
      __stack_chk_fail();
    }
    if (this_00->_M_string_length != 0) {
      __first._M_current = (this_00->_M_dataplus)._M_p;
      bVar7 = std::
              all_of<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,bool(*)(char)>
                        (__first,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  )(__first._M_current + this_00->_M_string_length),IsDigit);
      if (bVar7) {
LAB_00138d70:
        str_00._M_str = (this_00->_M_dataplus)._M_p;
        str_00._M_len = this_00->_M_string_length;
        oVar13 = ToIntegral<long>(str_00);
        if ((((undefined1  [16])
              oVar13.super__Optional_base<long,_true,_true>._M_payload.
              super__Optional_payload_base<long> & (undefined1  [16])0x1) == (undefined1  [16])0x0)
           || (0x1fffffffe <
               oVar13.super__Optional_base<long,_true,_true>._M_payload.
               super__Optional_payload_base<long>._M_payload + 0xffffffffU)) {
          prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (prVar11,
                     "script parse error: decimal numeric value only allowed in the range -0xFFFFFFFF...0xFFFFFFFF"
                    );
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
            __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          goto LAB_00139243;
        }
        CScript::push_int64(__return_storage_ptr__,
                            oVar13.super__Optional_base<long,_true,_true>._M_payload.
                            super__Optional_payload_base<long>._M_payload);
      }
      else {
        pcVar3 = (this_00->_M_dataplus)._M_p;
        if ((*pcVar3 == '-') && (1 < this_00->_M_string_length)) {
          bVar7 = std::
                  all_of<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,bool(*)(char)>
                            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              )(pcVar3 + 1),
                             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              )(pcVar3 + this_00->_M_string_length),IsDigit);
          if (bVar7) goto LAB_00138d70;
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value,
                   this_00,0,2);
        bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&value,"0x");
        if ((bVar7) && (2 < this_00->_M_string_length)) {
          pcVar4 = (this_00->_M_dataplus)._M_p;
          raw.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)&raw.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage;
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    ((string *)&raw,pcVar4 + 2,pcVar4 + this_00->_M_string_length);
          str_01._M_str =
               (char *)raw.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                       .super__Vector_impl_data._M_start;
          str_01._M_len =
               (size_t)raw.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                       .super__Vector_impl_data._M_finish;
          bVar7 = IsHex(str_01);
          std::__cxx11::string::~string((string *)&raw);
          std::__cxx11::string::~string((string *)&value);
          if (!bVar7) goto LAB_00138ec5;
          pcVar4 = (this_00->_M_dataplus)._M_p;
          value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)&value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage;
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    ((string *)&value,pcVar4 + 2,pcVar4 + this_00->_M_string_length);
          hex_str._M_str =
               (char *)value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start;
          hex_str._M_len =
               (size_t)value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
          ParseHex<unsigned_char>(&raw,hex_str);
          std::__cxx11::string::~string((string *)&value);
          uVar1 = (__return_storage_ptr__->super_CScriptBase)._size;
          uVar6 = uVar1 - 0x1d;
          if (uVar1 < 0x1d) {
            uVar6 = uVar1;
          }
          pCVar12 = (CScript *)
                    (__return_storage_ptr__->super_CScriptBase)._union.indirect_contents.indirect;
          if (uVar1 < 0x1d) {
            pCVar12 = __return_storage_ptr__;
          }
          prevector<28U,_unsigned_char,_unsigned_int,_int>::
          insert<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    (&__return_storage_ptr__->super_CScriptBase,
                     (uchar *)((long)&(pCVar12->super_CScriptBase)._union + (long)(int)uVar6),
                     (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )raw.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                       .super__Vector_impl_data._M_start,
                     (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )raw.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                       .super__Vector_impl_data._M_finish);
          this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&raw;
        }
        else {
          std::__cxx11::string::~string((string *)&value);
LAB_00138ec5:
          uVar5 = this_00->_M_string_length;
          if (((uVar5 < 2) || (pcVar3 = (this_00->_M_dataplus)._M_p, *pcVar3 != '\'')) ||
             (pcVar3[uVar5 - 1] != '\'')) {
            if ((anonymous_namespace)::ParseOpCode(std::__cxx11::string_const&)::ocp == '\0') {
              iVar8 = __cxa_guard_acquire(&(anonymous_namespace)::
                                           ParseOpCode(std::__cxx11::string_const&)::ocp);
              if (iVar8 != 0) {
                (anonymous_namespace)::ParseOpCode(std::__cxx11::string_const&)::ocp._8_4_ = 0;
                (anonymous_namespace)::ParseOpCode(std::__cxx11::string_const&)::ocp._16_8_ = 0;
                (anonymous_namespace)::ParseOpCode(std::__cxx11::string_const&)::ocp._24_8_ =
                     0x3c28c8;
                (anonymous_namespace)::ParseOpCode(std::__cxx11::string_const&)::ocp._32_8_ =
                     0x3c28c8;
                (anonymous_namespace)::ParseOpCode(std::__cxx11::string_const&)::ocp._40_8_ = 0;
                for (opcode = OP_0; opcode != OP_CHECKSIGADD; opcode = opcode + 1) {
                  if (OP_16 < opcode || opcode == OP_RESERVED) {
                    GetOpName_abi_cxx11_
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &value,opcode);
                    bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&value,"OP_UNKNOWN");
                    if (!bVar7) {
                      pmVar10 = std::
                                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opcodetype,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opcodetype>_>_>
                                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opcodetype,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opcodetype>_>_>
                                              *)(anonymous_namespace)::
                                                ParseOpCode(std::__cxx11::string_const&)::ocp,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)&value);
                      *pmVar10 = opcode;
                      iVar8 = std::__cxx11::
                              basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                              compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&value,0,3,"OP_");
                      if (iVar8 == 0) {
                        std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&raw,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&value,3,0xffffffffffffffff);
                        pmVar10 = std::
                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opcodetype,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opcodetype>_>_>
                                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opcodetype,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opcodetype>_>_>
                                                *)(anonymous_namespace)::
                                                  ParseOpCode(std::__cxx11::string_const&)::ocp,
                                               (key_type *)&raw);
                        *pmVar10 = opcode;
                        std::__cxx11::string::~string((string *)&raw);
                      }
                    }
                    std::__cxx11::string::~string((string *)&value);
                  }
                }
                __cxa_atexit(anon_unknown.dwarf_10a7ba::OpCodeParser::~OpCodeParser,
                             (anonymous_namespace)::ParseOpCode(std::__cxx11::string_const&)::ocp,
                             &__dso_handle);
                __cxa_guard_release(&(anonymous_namespace)::ParseOpCode(std::__cxx11::string_const&)
                                     ::ocp);
              }
            }
            cVar9 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opcodetype>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opcodetype>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opcodetype>_>_>
                    ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opcodetype>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opcodetype>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opcodetype>_>_>
                            *)(anonymous_namespace)::ParseOpCode(std::__cxx11::string_const&)::ocp,
                           this_00);
            if (cVar9._M_node !=
                (_Base_ptr)
                ((anonymous_namespace)::ParseOpCode(std::__cxx11::string_const&)::ocp + 8)) {
              CScript::operator<<(__return_storage_ptr__,cVar9._M_node[2]._M_color);
              goto LAB_00138f48;
            }
            prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar11,"script parse error: unknown opcode");
            if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
              __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            goto LAB_00139243;
          }
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          vector<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)&value,
                     (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(pcVar3 + 1),
                     (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(pcVar3 + (uVar5 - 1)),(allocator_type *)&raw);
          b._M_extent._M_extent_value =
               (long)value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                     .super__Vector_impl_data._M_finish -
               (long)value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                     .super__Vector_impl_data._M_start;
          b._M_ptr = value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                     .super__Vector_impl_data._M_start;
          CScript::operator<<(__return_storage_ptr__,b);
          this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value;
        }
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)this);
      }
    }
LAB_00138f48:
    this_00 = this_00 + 1;
  } while( true );
}

Assistant:

CScript ParseScript(const std::string& s)
{
    CScript result;

    std::vector<std::string> words = SplitString(s, " \t\n");

    for (const std::string& w : words) {
        if (w.empty()) {
            // Empty string, ignore. (SplitString doesn't combine multiple separators)
        } else if (std::all_of(w.begin(), w.end(), ::IsDigit) ||
                   (w.front() == '-' && w.size() > 1 && std::all_of(w.begin() + 1, w.end(), ::IsDigit)))
        {
            // Number
            const auto num{ToIntegral<int64_t>(w)};

            // limit the range of numbers ParseScript accepts in decimal
            // since numbers outside -0xFFFFFFFF...0xFFFFFFFF are illegal in scripts
            if (!num.has_value() || num > int64_t{0xffffffff} || num < -1 * int64_t{0xffffffff}) {
                throw std::runtime_error("script parse error: decimal numeric value only allowed in the "
                                         "range -0xFFFFFFFF...0xFFFFFFFF");
            }

            result << num.value();
        } else if (w.substr(0, 2) == "0x" && w.size() > 2 && IsHex(std::string(w.begin() + 2, w.end()))) {
            // Raw hex data, inserted NOT pushed onto stack:
            std::vector<unsigned char> raw = ParseHex(std::string(w.begin() + 2, w.end()));
            result.insert(result.end(), raw.begin(), raw.end());
        } else if (w.size() >= 2 && w.front() == '\'' && w.back() == '\'') {
            // Single-quoted string, pushed as data. NOTE: this is poor-man's
            // parsing, spaces/tabs/newlines in single-quoted strings won't work.
            std::vector<unsigned char> value(w.begin() + 1, w.end() - 1);
            result << value;
        } else {
            // opcode, e.g. OP_ADD or ADD:
            result << ParseOpCode(w);
        }
    }

    return result;
}